

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

void __thiscall
OpenMD::Thermo::getInertiaTensor(Thermo *this,Mat3x3d *inertiaTensor,Vector3d *angularMomentum)

{
  undefined8 *puVar1;
  StuntDouble *this_00;
  undefined1 auVar2 [16];
  double dVar3;
  undefined8 uVar4;
  uint i_9;
  Molecule *pMVar5;
  double (*padVar6) [3];
  double *pdVar7;
  pointer ppSVar8;
  uint i_1;
  long lVar9;
  double *pdVar10;
  double (*padVar11) [3];
  pointer ppSVar12;
  long lVar13;
  double *pdVar14;
  uint k;
  long lVar15;
  Snapshot *this_01;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  SquareMatrix3<double> result_5;
  MoleculeIterator i;
  Vector<double,_3U> result;
  Mat3x3d Itmp;
  SquareMatrix3<double> result_3;
  SquareMatrix3<double> result_4;
  undefined1 local_2e8 [16];
  double local_2d8 [10];
  double local_288;
  double dStack_280;
  double local_278;
  undefined8 uStack_270;
  undefined1 local_268 [24];
  Snapshot *local_250;
  double (*local_248) [3];
  MoleculeIterator local_240;
  double local_238 [10];
  Mat3x3d local_1e8;
  double local_198;
  double dStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158 [10];
  double local_108 [10];
  Vector3d local_b8;
  Vector3d local_98;
  double local_78 [9];
  
  this_01 = this->info_->sman_->currentSnapshot_;
  if ((this_01->hasInertiaTensor != true) || (this_01->hasCOMw == false)) {
    local_98.super_Vector<double,_3U>.data_[0] = 0.0;
    local_98.super_Vector<double,_3U>.data_[1] = 0.0;
    local_98.super_Vector<double,_3U>.data_[2] = 0.0;
    local_b8.super_Vector<double,_3U>.data_[2] = 0.0;
    local_b8.super_Vector<double,_3U>.data_[0] = 0.0;
    local_b8.super_Vector<double,_3U>.data_[1] = 0.0;
    local_250 = this_01;
    local_248 = (double (*) [3])inertiaTensor;
    getComAll(this,&local_98,&local_b8);
    local_240._M_node = (_Base_ptr)0x0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    pMVar5 = SimInfo::beginMolecule(this->info_,&local_240);
    if (pMVar5 == (Molecule *)0x0) {
      local_2e8._0_8_ = 0.0;
      dVar18 = 0.0;
      dVar19 = 0.0;
      dVar20 = 0.0;
      dVar17 = 0.0;
      dVar23 = 0.0;
    }
    else {
      local_278 = 0.0;
      uStack_270 = 0;
      local_2e8 = ZEXT816(0);
      local_268._0_8_ = 0.0;
      local_268._8_8_ = 0.0;
      local_288 = 0.0;
      dStack_280 = 0.0;
      do {
        ppSVar12 = (pMVar5->integrableObjects_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppSVar8 = (pMVar5->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppSVar12 != ppSVar8) {
          do {
            this_00 = *ppSVar12;
            if (this_00 == (StuntDouble *)0x0) break;
            lVar9 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).position.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
            local_2d8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + (long)this_00->localIndex_ * 0x18)
            ;
            pdVar7 = (double *)(lVar9 + (long)this_00->localIndex_ * 0x18);
            local_2d8[0] = *pdVar7;
            local_2d8[1] = pdVar7[1];
            local_238[0] = 0.0;
            local_238[1] = 0.0;
            local_238[2] = 0.0;
            lVar9 = 0;
            do {
              local_238[lVar9] = local_2d8[lVar9] - local_98.super_Vector<double,_3U>.data_[lVar9];
              dVar20 = local_238[2];
              dVar19 = local_238[1];
              dVar18 = local_238[0];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            lVar9 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).velocity.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
            local_2d8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + (long)this_00->localIndex_ * 0x18)
            ;
            pdVar7 = (double *)(lVar9 + (long)this_00->localIndex_ * 0x18);
            local_2d8[0] = *pdVar7;
            local_2d8[1] = pdVar7[1];
            local_238[0] = 0.0;
            local_238[1] = 0.0;
            local_238[2] = 0.0;
            lVar9 = 0;
            do {
              local_238[lVar9] = local_2d8[lVar9] - local_b8.super_Vector<double,_3U>.data_[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            dVar21 = dVar18 * dVar19;
            dVar22 = dVar19 * dVar19;
            dVar23 = dVar19 * dVar20;
            dVar17 = this_00->mass_;
            local_2d8[0] = local_238[2] * dVar19 - dVar20 * local_238[1];
            local_2d8[1] = local_238[0] * dVar20 - dVar18 * local_238[2];
            local_2d8[2] = dVar18 * local_238[1] - dVar19 * local_238[0];
            local_238[0] = 0.0;
            local_238[1] = 0.0;
            local_238[2] = 0.0;
            lVar9 = 0;
            do {
              local_238[lVar9] = local_2d8[lVar9] * dVar17;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            dVar3 = (double)local_268._8_8_ + dVar20 * dVar20 * dVar17;
            local_268._8_4_ = SUB84(dVar3,0);
            local_268._0_8_ = (double)local_268._0_8_ + dVar18 * dVar18 * dVar17;
            local_268._12_4_ = (int)((ulong)dVar3 >> 0x20);
            uVar16 = local_2e8._12_4_;
            local_2e8._8_4_ = local_2e8._8_4_;
            local_2e8._0_8_ = local_2e8._0_8_ + dVar18 * dVar20 * dVar17;
            local_2e8._12_4_ = uVar16;
            lVar9 = 0;
            do {
              (angularMomentum->super_Vector<double,_3U>).data_[lVar9] =
                   local_238[lVar9] + (angularMomentum->super_Vector<double,_3U>).data_[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            dVar18 = dVar17;
            dVar20 = dVar17;
            if (this_00->objType_ - otDAtom < 2) {
              uStack_180 = 0;
              dStack_170 = dVar19;
              local_198 = dVar17;
              dStack_190 = dVar17;
              local_188 = dVar17;
              local_178 = dVar23;
              local_168 = dVar21;
              dStack_160 = dVar22;
              StuntDouble::getA((RotMat3x3d *)local_238,this_00);
              local_158[6] = 0.0;
              local_158[7] = 0.0;
              local_158[4] = 0.0;
              local_158[5] = 0.0;
              local_158[2] = 0.0;
              local_158[3] = 0.0;
              local_158[0] = 0.0;
              local_158[1] = 0.0;
              local_158[8] = 0.0;
              pdVar7 = local_158;
              lVar9 = 0;
              padVar6 = (double (*) [3])local_238;
              do {
                lVar13 = 0;
                pdVar10 = pdVar7;
                do {
                  *pdVar10 = (((SquareMatrix<double,_3> *)*padVar6)->
                             super_RectMatrix<double,_3U,_3U>).data_[0][lVar13];
                  lVar13 = lVar13 + 1;
                  pdVar10 = pdVar10 + 3;
                } while (lVar13 != 3);
                lVar9 = lVar9 + 1;
                pdVar7 = pdVar7 + 1;
                padVar6 = padVar6 + 1;
              } while (lVar9 != 3);
              (*this_00->_vptr_StuntDouble[5])(local_78);
              dVar22 = dStack_160;
              dVar21 = local_168;
              dVar23 = local_178;
              dVar20 = local_188;
              dVar18 = dStack_190;
              dVar17 = local_198;
              local_108[6] = 0.0;
              local_108[7] = 0.0;
              local_108[4] = 0.0;
              local_108[5] = 0.0;
              local_108[2] = 0.0;
              local_108[3] = 0.0;
              local_108[0] = 0.0;
              local_108[1] = 0.0;
              local_108[8] = 0.0;
              pdVar7 = local_158;
              lVar9 = 0;
              do {
                lVar13 = 0;
                pdVar10 = local_78;
                do {
                  dVar19 = local_108[lVar9 * 3 + lVar13];
                  lVar15 = 0;
                  pdVar14 = pdVar10;
                  do {
                    dVar19 = dVar19 + pdVar7[lVar15] * *pdVar14;
                    lVar15 = lVar15 + 1;
                    pdVar14 = pdVar14 + 3;
                  } while (lVar15 != 3);
                  local_108[lVar9 * 3 + lVar13] = dVar19;
                  lVar13 = lVar13 + 1;
                  pdVar10 = pdVar10 + 1;
                } while (lVar13 != 3);
                lVar9 = lVar9 + 1;
                pdVar7 = pdVar7 + 3;
              } while (lVar9 != 3);
              local_2d8[6] = 0.0;
              local_2d8[7] = 0.0;
              local_2d8[4] = 0.0;
              local_2d8[5] = 0.0;
              local_2d8[2] = 0.0;
              local_2d8[3] = 0.0;
              local_2d8[0] = 0.0;
              local_2d8[1] = 0.0;
              local_2d8[8] = 0.0;
              pdVar7 = local_108;
              lVar9 = 0;
              do {
                lVar13 = 0;
                padVar6 = (double (*) [3])local_238;
                do {
                  dVar19 = local_2d8[lVar9 * 3 + lVar13];
                  lVar15 = 0;
                  padVar11 = padVar6;
                  do {
                    dVar19 = dVar19 + pdVar7[lVar15] * (*padVar11)[0];
                    lVar15 = lVar15 + 1;
                    padVar11 = padVar11 + 1;
                  } while (lVar15 != 3);
                  local_2d8[lVar9 * 3 + lVar13] = dVar19;
                  lVar13 = lVar13 + 1;
                  padVar6 = (double (*) [3])(*padVar6 + 1);
                } while (lVar13 != 3);
                lVar9 = lVar9 + 1;
                pdVar7 = pdVar7 + 3;
              } while (lVar9 != 3);
              pdVar7 = local_2d8;
              padVar6 = (double (*) [3])&local_1e8;
              lVar9 = 0;
              do {
                lVar13 = 0;
                do {
                  (((SquareMatrix<double,_3> *)*padVar6)->super_RectMatrix<double,_3U,_3U>).data_[0]
                  [lVar13] = pdVar7[lVar13] +
                             (((SquareMatrix<double,_3> *)*padVar6)->
                             super_RectMatrix<double,_3U,_3U>).data_[0][lVar13];
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                lVar9 = lVar9 + 1;
                padVar6 = padVar6 + 1;
                pdVar7 = pdVar7 + 3;
              } while (lVar9 != 3);
              lVar9 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).
                                       angularMomentum.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + this_00->storage_
                               );
              local_2d8[2] = *(double *)(lVar9 + 0x10 + (long)this_00->localIndex_ * 0x18);
              pdVar7 = (double *)(lVar9 + (long)this_00->localIndex_ * 0x18);
              local_2d8[0] = *pdVar7;
              local_2d8[1] = pdVar7[1];
              lVar9 = 0;
              do {
                (angularMomentum->super_Vector<double,_3U>).data_[lVar9] =
                     local_2d8[lVar9] + (angularMomentum->super_Vector<double,_3U>).data_[lVar9];
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              ppSVar8 = (pMVar5->integrableObjects_).
                        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            local_288 = local_288 + dVar21 * dVar17;
            dStack_280 = dStack_280 + dVar22 * dVar18;
            local_278 = local_278 + dVar23 * dVar20;
            ppSVar12 = ppSVar12 + 1;
          } while (ppSVar12 != ppSVar8);
        }
        pMVar5 = SimInfo::nextMolecule(this->info_,&local_240);
        dVar18 = (double)local_268._0_8_;
        dVar19 = (double)local_268._8_8_;
        dVar20 = local_278;
        dVar17 = local_288;
        dVar23 = dStack_280;
      } while (pMVar5 != (Molecule *)0x0);
    }
    inertiaTensor = (Mat3x3d *)local_248;
    this_01 = local_250;
    (*local_248)[0] = dVar23 + dVar19;
    (*local_248)[1] = -dVar17;
    (*local_248)[2] = -(double)local_2e8._0_8_;
    local_248[1][0] = -dVar17;
    local_248[1][1] = dVar19 + dVar18;
    auVar2._8_4_ = (int)local_2e8._0_8_;
    auVar2._0_8_ = -dVar20;
    auVar2._12_4_ = (int)((ulong)-(double)local_2e8._0_8_ >> 0x20);
    *(undefined1 (*) [16])(local_248[1] + 2) = auVar2;
    *(double *)((long)(local_248 + 2) + 8) = -dVar20;
    *(double *)((long)(local_248 + 2) + 0x10) = dVar23 + dVar18;
    padVar6 = (double (*) [3])&local_1e8;
    lVar9 = 0;
    padVar11 = local_248;
    do {
      lVar13 = 0;
      do {
        (((SquareMatrix<double,_3> *)*padVar11)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar13]
             = (((SquareMatrix<double,_3> *)*padVar6)->super_RectMatrix<double,_3U,_3U>).data_[0]
               [lVar13] +
               (((SquareMatrix<double,_3> *)*padVar11)->super_RectMatrix<double,_3U,_3U>).data_[0]
               [lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      lVar9 = lVar9 + 1;
      padVar11 = padVar11 + 1;
      padVar6 = padVar6 + 1;
    } while (lVar9 != 3);
    Snapshot::setCOMw(local_250,angularMomentum);
    Snapshot::setInertiaTensor(this_01,inertiaTensor);
  }
  Snapshot::getCOMw((Vector3d *)&local_1e8,this_01);
  if (&local_1e8 != (Mat3x3d *)angularMomentum) {
    (angularMomentum->super_Vector<double,_3U>).data_[2] =
         local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
    (angularMomentum->super_Vector<double,_3U>).data_[0] =
         local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
    (angularMomentum->super_Vector<double,_3U>).data_[1] =
         local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  }
  Snapshot::getInertiaTensor(&local_1e8,this_01);
  if (&local_1e8 != inertiaTensor) {
    lVar9 = 0;
    do {
      *(undefined8 *)
       ((long)(((SquareMatrix<double,_3> *)*(double (*) [3])inertiaTensor)->
              super_RectMatrix<double,_3U,_3U>).data_[0] + lVar9 + 0x10) =
           *(undefined8 *)
            ((long)local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar9 + 0x10);
      uVar4 = *(undefined8 *)
               ((long)local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar9 + 8);
      puVar1 = (undefined8 *)
               ((long)(((SquareMatrix<double,_3> *)*(double (*) [3])inertiaTensor)->
                      super_RectMatrix<double,_3U,_3U>).data_[0] + lVar9);
      *puVar1 = *(undefined8 *)
                 ((long)local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar9);
      puVar1[1] = uVar4;
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x48);
  }
  return;
}

Assistant:

void Thermo::getInertiaTensor(Mat3x3d& inertiaTensor,
                                Vector3d& angularMomentum) {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();
    Molecule::IntegrableObjectIterator j;
    StuntDouble* sd;

    if (!(snap->hasInertiaTensor && snap->hasCOMw)) {
      RealType xx = 0.0;
      RealType yy = 0.0;
      RealType zz = 0.0;
      RealType xy = 0.0;
      RealType xz = 0.0;
      RealType yz = 0.0;
      Vector3d com(0.0);
      Vector3d comVel(0.0);

      getComAll(com, comVel);

      SimInfo::MoleculeIterator i;
      Molecule* mol;

      Vector3d r(0.0);
      Vector3d v(0.0);
      Mat3x3d Itmp {};

      RealType m = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          r = sd->getPos() - com;
          v = sd->getVel() - comVel;

          m = sd->getMass();

          // Compute moment of intertia coefficients.
          xx += r[0] * r[0] * m;
          yy += r[1] * r[1] * m;
          zz += r[2] * r[2] * m;

          // compute products of intertia
          xy += r[0] * r[1] * m;
          xz += r[0] * r[2] * m;
          yz += r[1] * r[2] * m;

          angularMomentum += cross(r, v) * m;

          if (sd->isDirectional()) {
            RotMat3x3d A = sd->getA();
            Itmp += A.transpose() * sd->getI() * A;
            angularMomentum += sd->getJ();
          }
        }
      }

      inertiaTensor(0, 0) = yy + zz;
      inertiaTensor(0, 1) = -xy;
      inertiaTensor(0, 2) = -xz;
      inertiaTensor(1, 0) = -xy;
      inertiaTensor(1, 1) = xx + zz;
      inertiaTensor(1, 2) = -yz;
      inertiaTensor(2, 0) = -xz;
      inertiaTensor(2, 1) = -yz;
      inertiaTensor(2, 2) = xx + yy;

      inertiaTensor += Itmp;

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, inertiaTensor.getArrayPointer(), 9,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, angularMomentum.getArrayPointer(), 3,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

      snap->setCOMw(angularMomentum);
      snap->setInertiaTensor(inertiaTensor);
    }

    angularMomentum = snap->getCOMw();
    inertiaTensor   = snap->getInertiaTensor();

    return;
  }